

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_time.c
# Opt level: O0

int amqp_time_ms_until(amqp_time_t time)

{
  undefined1 auVar1 [16];
  uint64_t uVar2;
  ulong in_RDI;
  int left_ms;
  uint64_t delta_ns;
  uint64_t now_ns;
  undefined4 local_4;
  
  if (in_RDI == 0xffffffffffffffff) {
    local_4 = -1;
  }
  else if (in_RDI == 0) {
    local_4 = 0;
  }
  else {
    uVar2 = amqp_get_monotonic_timestamp();
    if (uVar2 == 0) {
      local_4 = -0xe;
    }
    else if (uVar2 < in_RDI) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = in_RDI - uVar2;
      local_4 = SUB164(auVar1 / ZEXT816(1000000),0);
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int amqp_time_ms_until(amqp_time_t time) {
  uint64_t now_ns;
  uint64_t delta_ns;
  int left_ms;

  if (UINT64_MAX == time.time_point_ns) {
    return -1;
  }
  if (0 == time.time_point_ns) {
    return 0;
  }

  now_ns = amqp_get_monotonic_timestamp();
  if (0 == now_ns) {
    return AMQP_STATUS_TIMER_FAILURE;
  }

  if (now_ns >= time.time_point_ns) {
    return 0;
  }

  delta_ns = time.time_point_ns - now_ns;
  left_ms = (int)(delta_ns / AMQP_NS_PER_MS);

  return left_ms;
}